

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

bool __thiscall QXmlStreamReaderPrivate::scanAfterLangleBang(QXmlStreamReaderPrivate *this)

{
  bool bVar1;
  uint uVar2;
  short tokenToInject;
  char *str;
  
  uVar2 = peekChar(this);
  if (uVar2 == 0x41) {
    str = "ATTLIST";
    tokenToInject = 0x1f;
  }
  else if (uVar2 == 0x44) {
    str = "DOCTYPE";
    tokenToInject = 0x1d;
  }
  else if (uVar2 == 0x45) {
    bVar1 = scanString(this,"ELEMENT",0x1e,true);
    if (bVar1) {
      return true;
    }
    str = "ENTITY";
    tokenToInject = 0x20;
  }
  else {
    if (uVar2 != 0x4e) {
      if (uVar2 != 0x5b) {
        return false;
      }
      str = "[CDATA[";
      tokenToInject = 0x1c;
      bVar1 = false;
      goto LAB_003525bd;
    }
    str = "NOTATION";
    tokenToInject = 0x21;
  }
  bVar1 = true;
LAB_003525bd:
  bVar1 = scanString(this,str,tokenToInject,bVar1);
  return bVar1;
}

Assistant:

bool QXmlStreamReaderPrivate::scanAfterLangleBang()
{
    switch (peekChar()) {
    case '[':
        return scanString(spell[CDATA_START], CDATA_START, false);
    case 'D':
        return scanString(spell[DOCTYPE], DOCTYPE);
    case 'A':
        return scanString(spell[ATTLIST], ATTLIST);
    case 'N':
        return scanString(spell[NOTATION], NOTATION);
    case 'E':
        if (scanString(spell[ELEMENT], ELEMENT))
            return true;
        return scanString(spell[ENTITY], ENTITY);

    default:
        ;
    };
    return false;
}